

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

void __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::~FreeList
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  pointer ppQVar1;
  ulong uVar2;
  pointer ppQVar3;
  
  this->_vptr_FreeList = (_func_int **)&PTR__FreeList_0019bd58;
  this->li_ = 0;
  ppQVar3 = (this->freeList).
            super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppQVar1 = (this->freeList).
            super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppQVar1 != ppQVar3) {
    uVar2 = 0;
    do {
      if (ppQVar3[uVar2] != (QueueElement *)0x0) {
        operator_delete__(ppQVar3[uVar2]);
        uVar2 = this->li_;
        ppQVar3 = (this->freeList).
                  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppQVar1 = (this->freeList).
                  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar2 = uVar2 + 1;
      this->li_ = uVar2;
    } while (uVar2 < (ulong)((long)ppQVar1 - (long)ppQVar3 >> 3));
  }
  if (ppQVar3 != (pointer)0x0) {
    operator_delete(ppQVar3);
    return;
  }
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }